

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintCDATA(TidyDocImpl *doc,uint indent,Node *node)

{
  uint saveWrap_00;
  Bool indentCData;
  TidyPrintImpl *pprint;
  uint saveWrap;
  Node *node_local;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  node_local._4_4_ = indent;
  if ((int)(doc->config).value[0x24].v == 0) {
    node_local._4_4_ = 0;
  }
  PCondFlushLineSmart(doc,node_local._4_4_);
  saveWrap_00 = WrapOff(doc);
  AddString(&doc->pprint,"<![CDATA[");
  PPrintText(doc,2,node_local._4_4_,node);
  AddString(&doc->pprint,"]]>");
  PCondFlushLineSmart(doc,node_local._4_4_);
  WrapOn(doc,saveWrap_00);
  return;
}

Assistant:

static void PPrintCDATA( TidyDocImpl* doc, uint indent, Node *node )
{
    uint saveWrap;
    TidyPrintImpl* pprint = &doc->pprint;
    Bool indentCData = cfgBool( doc, TidyIndentCdata );
    if ( !indentCData )
        indent = 0;

    PCondFlushLineSmart( doc, indent );
    saveWrap = WrapOff( doc );        /* disable wrapping */

    AddString( pprint, "<![CDATA[" );
    PPrintText( doc, COMMENT, indent, node );
    AddString( pprint, "]]>" );

    PCondFlushLineSmart( doc, indent );
    WrapOn( doc, saveWrap );          /* restore wrapping */
}